

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitstream.cpp
# Opt level: O0

ConstantValue *
slang::ast::Bitstream::evaluateTarget
          (StreamingConcatenationExpression *lhs,Expression *rhs,EvalContext *context)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  bool bVar1;
  SmallVectorBase<slang::ConstantValue_*> *value;
  SmallVectorBase<slang::ConstantValue_*> *packed_00;
  uint64_t uVar2;
  EvalContext *pEVar3;
  Diagnostic *arg;
  int *in_RDX;
  StreamingConcatenationExpression *in_RSI;
  ConstantValue *in_RDI;
  uint64_t tSize;
  const_iterator iterEnd;
  const_iterator iter;
  uint64_t bitOffset;
  SmallVector<slang::ConstantValue_*,_5UL> packed;
  Diagnostic *diag_1;
  DynamicSize elemSize;
  Diagnostic *diag;
  uint64_t dynamicSize;
  uint64_t targetWidth;
  uint64_t srcSize;
  ConstantValue rvalue;
  EvalContext *in_stack_000003c0;
  uint64_t *in_stack_000003c8;
  uint64_t *in_stack_000003d0;
  PackIterator in_stack_000003d8;
  PackIterator *in_stack_000003e0;
  StreamingConcatenationExpression *in_stack_000003e8;
  SmallVectorBase<slang::ConstantValue> *in_stack_00000400;
  string *in_stack_fffffffffffffd28;
  ConstantValue *pCVar4;
  EvalContext *in_stack_fffffffffffffd30;
  Expression *in_stack_fffffffffffffd38;
  Diagnostic *in_stack_fffffffffffffd40;
  StreamingConcatenationExpression *in_stack_fffffffffffffd58;
  uint64_t in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  EvalContext *in_stack_fffffffffffffd78;
  EvalContext *this;
  SourceLocation in_stack_fffffffffffffd80;
  SourceLocation SVar5;
  SourceLocation in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  DiagCode code;
  undefined8 in_stack_fffffffffffffdc8;
  BitstreamSizeMode mode;
  StreamingConcatenationExpression *in_stack_fffffffffffffdd0;
  ConstantValue *in_stack_fffffffffffffdd8;
  SymbolIndex *local_1b0;
  undefined1 local_1a0 [72];
  uint64_t in_stack_fffffffffffffea8;
  uint64_t in_stack_fffffffffffffeb0;
  ConstantValue *in_stack_fffffffffffffeb8;
  DynamicSize local_f0;
  SourceLocation local_d8;
  SourceLocation SStack_d0;
  undefined4 local_bc;
  SourceLocation local_98;
  SourceLocation SStack_90;
  undefined4 local_7c;
  Diagnostic *local_78;
  SmallVectorBase<slang::ConstantValue_*> *local_70;
  SmallVectorBase<slang::ConstantValue_*> *local_68;
  SmallVectorBase<slang::ConstantValue_*> *local_60;
  undefined4 local_58;
  BitstreamSizeMode in_stack_ffffffffffffffc4;
  StreamingConcatenationExpression *in_stack_ffffffffffffffc8;
  
  code = SUB84((ulong)in_stack_fffffffffffffd90 >> 0x20,0);
  mode = (BitstreamSizeMode)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
  Expression::eval(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x54733c);
  if (bVar1) {
    value = (SmallVectorBase<slang::ConstantValue_*> *)
            slang::ConstantValue::getBitstreamWidth(in_stack_fffffffffffffdd8);
    local_60 = value;
    packed_00 = (SmallVectorBase<slang::ConstantValue_*> *)
                StreamingConcatenationExpression::getBitstreamWidth(in_RSI);
    local_70 = (SmallVectorBase<slang::ConstantValue_*> *)0x0;
    local_68 = packed_00;
    if (*in_RDX == 0x11) {
      local_70 = (SmallVectorBase<slang::ConstantValue_*> *)
                 bitstreamCastRemainingSize<slang::ast::StreamingConcatenationExpression>
                           ((StreamingConcatenationExpression *)
                            CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68),
                            in_stack_fffffffffffffd60);
      if (local_60 < local_70) {
        local_7c = 0x2c0007;
        local_98 = (in_RSI->super_Expression).sourceRange.startLoc;
        SStack_90 = (in_RSI->super_Expression).sourceRange.endLoc;
        range.endLoc = in_stack_fffffffffffffd88;
        range.startLoc = in_stack_fffffffffffffd80;
        local_78 = EvalContext::addDiag(in_stack_fffffffffffffd78,code,range);
        formatWidth<slang::ast::StreamingConcatenationExpression>
                  (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd30);
        Diagnostic::operator<<<unsigned_long>
                  (in_stack_fffffffffffffd40,(unsigned_long)in_stack_fffffffffffffd38);
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        local_58 = 1;
        goto LAB_00547b6a;
      }
    }
    else {
      if (local_60 < packed_00) {
        local_bc = 0x2c0007;
        local_d8 = (in_RSI->super_Expression).sourceRange.startLoc;
        SStack_d0 = (in_RSI->super_Expression).sourceRange.endLoc;
        range_00.endLoc = in_stack_fffffffffffffd88;
        range_00.startLoc = in_stack_fffffffffffffd80;
        EvalContext::addDiag(in_stack_fffffffffffffd78,code,range_00);
        Diagnostic::operator<<<unsigned_long>
                  (in_stack_fffffffffffffd40,(unsigned_long)in_stack_fffffffffffffd38);
        Diagnostic::operator<<<unsigned_long>
                  (in_stack_fffffffffffffd40,(unsigned_long)in_stack_fffffffffffffd38);
        slang::ConstantValue::ConstantValue
                  ((ConstantValue *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        local_58 = 1;
        goto LAB_00547b6a;
      }
      bVar1 = StreamingConcatenationExpression::isFixedSize(in_stack_fffffffffffffd58);
      if (!bVar1) {
        dynamicBitstreamSize(in_stack_fffffffffffffdd0,mode);
        bVar1 = DynamicSize::operator_cast_to_bool(&local_f0);
        if (!bVar1) {
          range_01.endLoc = in_stack_fffffffffffffd88;
          range_01.startLoc = in_stack_fffffffffffffd80;
          EvalContext::addDiag(in_stack_fffffffffffffd78,code,range_01);
          formatWidth<slang::ast::StreamingConcatenationExpression>
                    (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
          Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd30);
          Diagnostic::operator<<<unsigned_long>
                    (in_stack_fffffffffffffd40,(unsigned_long)in_stack_fffffffffffffd38);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
          local_58 = 1;
          goto LAB_00547b6a;
        }
        local_70 = (SmallVectorBase<slang::ConstantValue_*> *)((long)local_60 - (long)local_68);
        if (local_f0.multiplier != 0) {
          local_70 = (SmallVectorBase<slang::ConstantValue_*> *)
                     ((long)local_70 - (ulong)local_70 % local_f0.multiplier);
        }
      }
    }
    uVar2 = StreamingConcatenationExpression::getSliceSize(in_RSI);
    if (uVar2 != 0) {
      in_stack_fffffffffffffd88 =
           (SourceLocation)StreamingConcatenationExpression::getSliceSize(in_RSI);
      reOrder(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      slang::ConstantValue::operator=
                ((ConstantValue *)in_stack_fffffffffffffd30,
                 (ConstantValue *)in_stack_fffffffffffffd28);
      slang::ConstantValue::~ConstantValue((ConstantValue *)0x547849);
    }
    SVar5 = (SourceLocation)local_1a0;
    SmallVector<slang::ConstantValue_*,_5UL>::SmallVector
              ((SmallVector<slang::ConstantValue_*,_5UL> *)0x54785b);
    packBitstream((ConstantValue *)value,packed_00);
    local_1b0 = (SymbolIndex *)
                std::cbegin<slang::SmallVector<slang::ConstantValue*,5ul>>
                          ((SmallVector<slang::ConstantValue_*,_5UL> *)0x547888);
    this = (EvalContext *)local_1b0;
    pEVar3 = (EvalContext *)
             std::cend<slang::SmallVector<slang::ConstantValue*,5ul>>
                       ((SmallVector<slang::ConstantValue_*,_5UL> *)0x5478a9);
    pCVar4 = (ConstantValue *)0x0;
    bVar1 = unpackConcatenation(in_stack_000003e8,in_stack_000003e0,in_stack_000003d8,
                                in_stack_000003d0,in_stack_000003c8,in_stack_000003c0,
                                in_stack_00000400);
    if (bVar1) {
      if (((EvalContext *)local_1b0 != pEVar3) && (*in_RDX == 0x11)) {
        slang::ConstantValue::getBitstreamWidth((ConstantValue *)packed_00);
        while (local_1b0 = &(((EvalContext *)local_1b0)->astCtx).lookupIndex,
              (EvalContext *)local_1b0 != pEVar3) {
          in_stack_fffffffffffffd40 =
               (Diagnostic *)slang::ConstantValue::getBitstreamWidth((ConstantValue *)packed_00);
        }
        range_02.endLoc = in_stack_fffffffffffffd88;
        range_02.startLoc = SVar5;
        arg = EvalContext::addDiag(this,SUB84(uVar2 >> 0x20,0),range_02);
        in_stack_fffffffffffffd30 =
             (EvalContext *)
             Diagnostic::operator<<<unsigned_long>(in_stack_fffffffffffffd40,(unsigned_long)arg);
        Diagnostic::operator<<<unsigned_long>(in_stack_fffffffffffffd40,(unsigned_long)arg);
      }
      slang::ConstantValue::ConstantValue((ConstantValue *)in_stack_fffffffffffffd30,pCVar4);
    }
    else {
      slang::ConstantValue::ConstantValue((ConstantValue *)in_stack_fffffffffffffd30,pCVar4);
    }
    local_58 = 1;
    SmallVector<slang::ConstantValue_*,_5UL>::~SmallVector
              ((SmallVector<slang::ConstantValue_*,_5UL> *)0x547b6a);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
    local_58 = 1;
  }
LAB_00547b6a:
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x547b77);
  return in_RDI;
}

Assistant:

ConstantValue Bitstream::evaluateTarget(const StreamingConcatenationExpression& lhs,
                                        const Expression& rhs, EvalContext& context) {
    ConstantValue rvalue = rhs.eval(context);
    if (!rvalue)
        return nullptr;

    auto srcSize = rvalue.getBitstreamWidth();
    auto targetWidth = lhs.getBitstreamWidth();
    uint64_t dynamicSize = 0;

    if (rhs.kind == ExpressionKind::Streaming) {
        // Check srcSize == targetWidth + dynamicSize, then issue an error if not.
        dynamicSize = bitstreamCastRemainingSize(lhs, srcSize);
        if (dynamicSize > srcSize) {
            auto& diag = context.addDiag(diag::BadStreamSize, lhs.sourceRange);
            diag << formatWidth(lhs, BitstreamSizeMode::DestFill);
            diag << srcSize;
            return nullptr;
        }
    }
    else {
        // Source size must be at least as large as the target size.
        if (targetWidth > srcSize) {
            context.addDiag(diag::BadStreamSize, lhs.sourceRange) << targetWidth << srcSize;
            return nullptr;
        }

        if (!lhs.isFixedSize()) {
            auto elemSize = dynamicBitstreamSize(lhs, BitstreamSizeMode::DestFill);
            if (!elemSize) {
                auto& diag = context.addDiag(diag::BadStreamSize, lhs.sourceRange);
                diag << formatWidth(lhs, BitstreamSizeMode::DestFill);
                diag << srcSize;
                return nullptr;
            }

            dynamicSize = srcSize - targetWidth;
            if (elemSize.multiplier)
                dynamicSize -= dynamicSize % elemSize.multiplier; // do not exceed srcSize
        }
    }

    if (lhs.getSliceSize() > 0)
        rvalue = reOrder(std::move(rvalue), lhs.getSliceSize(), targetWidth + dynamicSize);

    SmallVector<ConstantValue*> packed;
    packBitstream(rvalue, packed);

    uint64_t bitOffset = 0;
    auto iter = std::cbegin(packed);
    auto iterEnd = std::cend(packed);
    if (!unpackConcatenation(lhs, iter, iterEnd, bitOffset, dynamicSize, context))
        return nullptr;

    // (iter==iterEnd && !bitOffset) implies target and source have exactly the same size.
    if (iter == iterEnd) {
        SLANG_ASSERT(dynamicSize == 0);
        if (bitOffset > 0) {
            // Target longer than source
            context.addDiag(diag::BadStreamSize, lhs.sourceRange) << srcSize + bitOffset << srcSize;
        }
    }
    else if (rhs.kind == ExpressionKind::Streaming) {
        // Target shorter than source; this is legal unless rhs is a streaming concatenation.
        SLANG_ASSERT(srcSize >= (*iter)->getBitstreamWidth());
        auto tSize = srcSize - (*iter++)->getBitstreamWidth() + bitOffset;
        while (iter != iterEnd)
            tSize -= (*iter++)->getBitstreamWidth();
        context.addDiag(diag::BadStreamSize, lhs.sourceRange) << tSize << srcSize;
    }

    return rvalue;
}